

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

vector<CSegment_*,_std::allocator<CSegment_*>_> * __thiscall
CWire::Bend(vector<CSegment_*,_std::allocator<CSegment_*>_> *__return_storage_ptr__,CWire *this,
           int iX1,int iY1,int iX2,int iY2,int iZ1,int iZ2,int iZ3)

{
  CSegment *pCVar1;
  int iVar2;
  int iVar3;
  int iX2_00;
  int iY2_00;
  CSegment *local_58;
  CSegment *pNNSegment;
  CSegment *pNSegment;
  CSegment *local_38;
  CSegment *pSegment;
  int local_28;
  int local_24;
  int iY2_local;
  int iX2_local;
  int iY1_local;
  int iX1_local;
  CWire *this_local;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *Candidate;
  
  pSegment._7_1_ = 0;
  local_28 = iY2;
  local_24 = iX2;
  iY2_local = iY1;
  iX2_local = iX1;
  _iY1_local = this;
  this_local = (CWire *)__return_storage_ptr__;
  std::vector<CSegment_*,_std::allocator<CSegment_*>_>::vector(__return_storage_ptr__);
  local_38 = CSegment::New();
  pNNSegment = CSegment::New();
  local_58 = CSegment::New();
  pCVar1 = local_38;
  if (local_38 == (CSegment *)0x0) {
    __assert_fail("pSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x42b,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
  }
  if (pNNSegment == (CSegment *)0x0) {
    __assert_fail("pNSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x42c,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
  }
  if (local_58 == (CSegment *)0x0) {
    __assert_fail("pNNSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x42d,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
  }
  iVar2 = CPoint::X(this->m_pPointS);
  iVar3 = CPoint::Y(this->m_pPointS);
  CSegment::Initialize(pCVar1,iVar2,iVar3,iX2_local,iY2_local,iZ1,this);
  CSegment::Initialize(pNNSegment,iX2_local,iY2_local,local_24,local_28,iZ2,this);
  iVar3 = local_24;
  iVar2 = local_28;
  pCVar1 = local_58;
  iX2_00 = CPoint::X(this->m_pPointE);
  iY2_00 = CPoint::Y(this->m_pPointE);
  CSegment::Initialize(pCVar1,iVar3,iVar2,iX2_00,iY2_00,iZ3,this);
  std::vector<CSegment_*,_std::allocator<CSegment_*>_>::push_back(__return_storage_ptr__,&local_38);
  std::vector<CSegment_*,_std::allocator<CSegment_*>_>::push_back
            (__return_storage_ptr__,&pNNSegment);
  std::vector<CSegment_*,_std::allocator<CSegment_*>_>::push_back(__return_storage_ptr__,&local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<CSegment*> CWire::Bend(int iX1, int iY1, int iX2, int iY2, int iZ1, int iZ2, int iZ3)
{
	vector<CSegment*>	Candidate;

	CSegment*	pSegment	=	CSegment::New();//new	CSegment;
	CSegment*	pNSegment	=	CSegment::New();//new	CSegment;
	CSegment*	pNNSegment	=	CSegment::New();//new	CSegment;
	
	assert(pSegment);
	assert(pNSegment);
	assert(pNNSegment);
	
	pSegment->Initialize(m_pPointS->X(),m_pPointS->Y(),iX1,iY1,iZ1,this);
	pNSegment->Initialize(iX1,iY1,iX2,iY2,iZ2,this);
	pNNSegment->Initialize(iX2,iY2,m_pPointE->X(),m_pPointE->Y(),iZ3,this);
	
	Candidate.push_back(pSegment);
	Candidate.push_back(pNSegment);
	Candidate.push_back(pNNSegment);
	
	return	Candidate;
}